

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_unpacked_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,
          bool register_expression_read)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  byte local_5d;
  string local_50;
  undefined1 local_2b;
  byte local_2a;
  byte local_29;
  bool is_packed;
  bool is_remapped;
  SPIRExpression *pSStack_28;
  bool need_transpose;
  SPIRExpression *e;
  bool register_expression_read_local;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  e._3_1_ = register_expression_read;
  e._4_4_ = id;
  pCStack_18 = this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  pSStack_28 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,id);
  local_5d = 0;
  if (pSStack_28 != (SPIRExpression *)0x0) {
    local_5d = pSStack_28->need_transpose;
  }
  local_29 = local_5d & 1;
  local_2a = Compiler::has_extended_decoration
                       (&this->super_Compiler,e._4_4_,SPIRVCrossDecorationPhysicalTypeID);
  local_2b = Compiler::has_extended_decoration
                       (&this->super_Compiler,e._4_4_,SPIRVCrossDecorationPhysicalTypePacked);
  if (((local_29 & 1) == 0) && (((local_2a & 1) != 0 || ((bool)local_2b)))) {
    to_expression_abi_cxx11_(&local_50,this,e._4_4_,(bool)(e._3_1_ & 1));
    uVar2 = Compiler::expression_type_id(&this->super_Compiler,e._4_4_);
    pSVar3 = Compiler::get_pointee_type(&this->super_Compiler,uVar2);
    uVar2 = Compiler::get_extended_decoration
                      (&this->super_Compiler,e._4_4_,SPIRVCrossDecorationPhysicalTypeID);
    bVar1 = Compiler::has_extended_decoration
                      (&this->super_Compiler,e._4_4_,SPIRVCrossDecorationPhysicalTypePacked);
    (*(this->super_Compiler)._vptr_Compiler[0x23])
              (__return_storage_ptr__,this,&local_50,pSVar3,(ulong)uVar2,(ulong)bVar1,0);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    to_expression_abi_cxx11_(__return_storage_ptr__,this,e._4_4_,(bool)(e._3_1_ & 1));
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_unpacked_expression(uint32_t id, bool register_expression_read)
{
	// If we need to transpose, it will also take care of unpacking rules.
	auto *e = maybe_get<SPIRExpression>(id);
	bool need_transpose = e && e->need_transpose;
	bool is_remapped = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID);
	bool is_packed = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked);

	if (!need_transpose && (is_remapped || is_packed))
	{
		return unpack_expression_type(to_expression(id, register_expression_read),
		                              get_pointee_type(expression_type_id(id)),
		                              get_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID),
		                              has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked), false);
	}
	else
		return to_expression(id, register_expression_read);
}